

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq1_s(block_iq1_s *x,float *y,int64_t k)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  int j;
  int8_t *grid;
  int l;
  float delta;
  float dl;
  int ib;
  uint16_t *qh;
  uint8_t *qs;
  float d;
  int i;
  int64_t nb;
  float local_58;
  int local_54;
  int local_48;
  int local_3c;
  long local_30;
  int local_24;
  long local_10;
  
  local_10 = in_RSI;
  for (local_24 = 0; (long)local_24 < in_RDX / 0x100; local_24 = local_24 + 1) {
    fVar5 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_24 * 0x32));
    local_30 = in_RDI + (long)local_24 * 0x32 + 2;
    lVar4 = in_RDI + (long)local_24 * 0x32 + 0x22;
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      uVar2 = *(ushort *)(lVar4 + (long)local_3c * 2);
      local_58 = -0.125;
      if ((*(ushort *)(lVar4 + (long)local_3c * 2) & 0x8000) == 0) {
        local_58 = 0.125;
      }
      for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
        bVar1 = *(byte *)(local_30 + local_48);
        uVar3 = *(ushort *)(lVar4 + (long)local_3c * 2);
        for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
          *(float *)(local_10 + (long)local_54 * 4) =
               fVar5 * (float)(((int)(uint)uVar2 >> 0xc & 7U) * 2 + 1) *
               ((float)(int)*(char *)((long)iq1s_grid +
                                     (long)local_54 +
                                     (long)(int)((uint)bVar1 |
                                                ((int)(uint)uVar3 >>
                                                 ((char)local_48 * '\x03' & 0x1fU) & 7U) << 8) * 8)
               + local_58);
        }
        local_10 = local_10 + 0x20;
      }
      local_30 = local_30 + 4;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq1_s(const block_iq1_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t  * qs = x[i].qs;
        const uint16_t * qh = x[i].qh;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float dl = d * (2*((qh[ib] >> 12) & 7) + 1);
            const float delta = qh[ib] & 0x8000 ? -IQ1S_DELTA : IQ1S_DELTA;
            for (int l = 0; l < 4; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + (qs[l] | (((qh[ib] >> 3*l) & 7) << 8)));
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl * (grid[j] + delta);
                }
                y += 8;
            }
            qs += 4;
        }
    }
}